

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O3

void __thiscall Assimp::MDLImporter::InternReadFile_3DGS_MDL345(MDLImporter *this)

{
  aiVector3D **__s;
  aiFace *paVar1;
  ai_real *szPos;
  size_t __n;
  ushort uVar2;
  int iVar3;
  Header *pcHeader;
  uchar *puVar4;
  aiMesh *paVar5;
  ulong *puVar6;
  aiFace *paVar7;
  aiNode *this_00;
  uint *puVar8;
  aiMesh **ppaVar9;
  aiVector3D *paVar10;
  Logger *pLVar11;
  runtime_error *this_01;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  Header *pcSrc;
  uint c;
  ulong uVar17;
  long lVar18;
  float fVar19;
  uint iSkip;
  ai_real *local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (this->pScene == (aiScene *)0x0) {
    __assert_fail("__null != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                  ,0x235,"void Assimp::MDLImporter::InternReadFile_3DGS_MDL345()");
  }
  pcHeader = (Header *)this->mBuffer;
  ValidateHeader_Quake1(this,pcHeader);
  pcSrc = pcHeader + 1;
  if (pcHeader->num_skins != 0) {
    uVar14 = this->iFileSize;
    puVar4 = this->mBuffer;
    uVar13 = 0;
    do {
      if ((Header *)(puVar4 + uVar14) <= pcSrc) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"Texture data past end of file.","");
        std::runtime_error::runtime_error(this_01,(string *)local_50);
        *(undefined ***)this_01 = &PTR__runtime_error_007fc4b8;
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      local_50[0] = (undefined1 *)CONCAT44(local_50[0]._4_4_,-(uint)(uVar13 != 0));
      if (this->iGSFileVersion < 5) {
        CreateTexture_3DGS_MDL4(this,(uchar *)&pcSrc->version,pcSrc->ident,(uint *)local_50);
      }
      else {
        CreateTexture_3DGS_MDL5(this,(uchar *)&pcSrc->version,pcSrc->ident,(uint *)local_50);
      }
      pcSrc = (Header *)((long)pcSrc->scale + (((ulong)local_50[0] & 0xffffffff) - 4));
      uVar13 = uVar13 + 1;
    } while (uVar13 < (uint)pcHeader->num_skins);
  }
  local_70 = pcSrc->scale + (long)pcHeader->synctype + -2;
  szPos = local_70 + (long)pcHeader->num_tris * 3;
  SizeCheck(this,szPos,
            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
            ,0x276);
  SetupMaterialProperties_3DGS_MDL5_Quake1(this);
  paVar5 = (aiMesh *)operator_new(0x520);
  __s = &paVar5->mVertices;
  memset(__s,0,0xcc);
  paVar5->mBones = (aiBone **)0x0;
  paVar5->mMaterialIndex = 0;
  (paVar5->mName).length = 0;
  (paVar5->mName).data[0] = '\0';
  memset((paVar5->mName).data + 1,0x1b,0x3ff);
  paVar5->mNumAnimMeshes = 0;
  paVar5->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar5->mMethod = 0;
  (paVar5->mAABB).mMin.x = 0.0;
  (paVar5->mAABB).mMin.y = 0.0;
  (paVar5->mAABB).mMin.z = 0.0;
  (paVar5->mAABB).mMax.x = 0.0;
  (paVar5->mAABB).mMax.y = 0.0;
  (paVar5->mAABB).mMax.z = 0.0;
  memset(paVar5->mColors,0,0xa0);
  paVar5->mPrimitiveTypes = 4;
  uVar14 = pcHeader->num_tris;
  uVar16 = (ulong)uVar14;
  paVar5->mNumVertices = uVar14 * 3;
  paVar5->mNumFaces = uVar14;
  puVar6 = (ulong *)operator_new__(uVar16 * 0x10 + 8);
  paVar1 = (aiFace *)(puVar6 + 1);
  *puVar6 = uVar16;
  if (uVar16 != 0) {
    paVar7 = paVar1;
    do {
      paVar7->mNumIndices = 0;
      paVar7->mIndices = (uint *)0x0;
      paVar7 = paVar7 + 1;
    } while (paVar7 != paVar1 + uVar16);
  }
  paVar5->mFaces = paVar1;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  this->pScene->mRootNode = this_00;
  this->pScene->mRootNode->mNumMeshes = 1;
  puVar8 = (uint *)operator_new__(4);
  this->pScene->mRootNode->mMeshes = puVar8;
  *this->pScene->mRootNode->mMeshes = 0;
  this->pScene->mNumMeshes = 1;
  ppaVar9 = (aiMesh **)operator_new__(8);
  this->pScene->mMeshes = ppaVar9;
  *this->pScene->mMeshes = paVar5;
  iVar3 = pcHeader->num_tris;
  paVar5->mNumVertices = iVar3 * 3;
  uVar16 = (ulong)(uint)(iVar3 * 3) * 0xc;
  paVar10 = (aiVector3D *)operator_new__(uVar16);
  if (iVar3 == 0) {
    *__s = paVar10;
    paVar10 = (aiVector3D *)operator_new__(uVar16);
  }
  else {
    __n = ((uVar16 - 0xc) / 0xc) * 0xc + 0xc;
    memset(paVar10,0,__n);
    *__s = paVar10;
    paVar10 = (aiVector3D *)operator_new__(uVar16);
    memset(paVar10,0,__n);
  }
  paVar5->mNormals = paVar10;
  if (pcHeader->synctype != 0) {
    paVar10 = (aiVector3D *)operator_new__(uVar16);
    if (iVar3 != 0) {
      memset(paVar10,0,((uVar16 - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar5->mTextureCoords[0] = paVar10;
    paVar5->mNumUVComponents[0] = 2;
  }
  if ((*szPos == 0.0) || (this->iGSFileVersion < 4)) {
    SizeCheck(this,szPos + (long)pcHeader->num_verts + 7,
              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
              ,0x2a2);
    if (pcHeader->num_tris != 0) {
      uVar16 = 0;
      uVar17 = 0;
      do {
        puVar8 = (uint *)operator_new__(0xc);
        paVar5->mFaces[uVar16].mIndices = puVar8;
        paVar5->mFaces[uVar16].mNumIndices = 3;
        lVar18 = 0;
        do {
          uVar2 = *(ushort *)((long)local_70 + lVar18 * 2);
          uVar14 = (uint)uVar2;
          if ((uint)pcHeader->num_verts <= (uint)uVar2) {
            uVar14 = pcHeader->num_verts - 1;
            pLVar11 = DefaultLogger::get();
            Logger::warn(pLVar11,"Index overflow in MDLn vertex list");
          }
          paVar10 = paVar5->mVertices;
          uVar15 = uVar17 + lVar18 & 0xffffffff;
          uVar12 = (ulong)uVar14;
          fVar19 = (float)*(byte *)(szPos + uVar12 + 7) * pcHeader->scale[0];
          paVar10[uVar15].x = fVar19;
          paVar10[uVar15].x = fVar19 + pcHeader->translate[0];
          fVar19 = (float)*(byte *)((long)szPos + uVar12 * 4 + 0x1d) * pcHeader->scale[1];
          paVar10[uVar15].y = fVar19;
          paVar10[uVar15].y = fVar19 + pcHeader->translate[1];
          fVar19 = (float)*(byte *)((long)szPos + uVar12 * 4 + 0x1e) * pcHeader->scale[2];
          paVar10[uVar15].z = fVar19;
          paVar10[uVar15].z = fVar19 + pcHeader->translate[2];
          MD2::LookupNormalIndex
                    (*(uint8_t *)((long)szPos + uVar12 * 4 + 0x1f),paVar5->mNormals + uVar15);
          if (pcHeader->synctype != 0) {
            ImportUVCoordinate_3DGS_MDL345
                      (this,paVar5->mTextureCoords[0] + uVar15,(TexCoord_MDL3 *)pcSrc,
                       (uint)*(ushort *)((long)local_70 + lVar18 * 2 + 6));
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
        uVar14 = (uint)uVar17;
        *paVar5->mFaces[uVar16].mIndices = uVar14 + 2;
        paVar5->mFaces[uVar16].mIndices[1] = uVar14 + 1;
        paVar5->mFaces[uVar16].mIndices[2] = uVar14;
        local_70 = local_70 + 3;
        uVar16 = uVar16 + 1;
        uVar17 = (ulong)(uVar14 + 3);
      } while (uVar16 < (uint)pcHeader->num_tris);
    }
  }
  else {
    SizeCheck(this,szPos + (long)pcHeader->num_verts * 2 + 9,
              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
              ,0x2d9);
    if (pcHeader->num_tris != 0) {
      uVar16 = 0;
      uVar17 = 0;
      do {
        puVar8 = (uint *)operator_new__(0xc);
        paVar5->mFaces[uVar16].mIndices = puVar8;
        paVar5->mFaces[uVar16].mNumIndices = 3;
        lVar18 = 0;
        do {
          uVar2 = *(ushort *)((long)local_70 + lVar18 * 2);
          uVar14 = (uint)uVar2;
          if ((uint)pcHeader->num_verts <= (uint)uVar2) {
            uVar14 = pcHeader->num_verts - 1;
            pLVar11 = DefaultLogger::get();
            Logger::warn(pLVar11,"Index overflow in MDLn vertex list");
          }
          paVar10 = paVar5->mVertices;
          uVar15 = uVar17 + lVar18 & 0xffffffff;
          uVar12 = (ulong)uVar14;
          fVar19 = (float)*(ushort *)(szPos + uVar12 * 2 + 9) * pcHeader->scale[0];
          paVar10[uVar15].x = fVar19;
          paVar10[uVar15].x = fVar19 + pcHeader->translate[0];
          fVar19 = (float)*(ushort *)((long)szPos + uVar12 * 8 + 0x26) * pcHeader->scale[1];
          paVar10[uVar15].y = fVar19;
          paVar10[uVar15].y = fVar19 + pcHeader->translate[1];
          fVar19 = (float)*(ushort *)(szPos + uVar12 * 2 + 10) * pcHeader->scale[2];
          paVar10[uVar15].z = fVar19;
          paVar10[uVar15].z = fVar19 + pcHeader->translate[2];
          MD2::LookupNormalIndex
                    (*(uint8_t *)((long)szPos + uVar12 * 8 + 0x2a),paVar5->mNormals + uVar15);
          if (pcHeader->synctype != 0) {
            ImportUVCoordinate_3DGS_MDL345
                      (this,paVar5->mTextureCoords[0] + uVar15,(TexCoord_MDL3 *)pcSrc,
                       (uint)*(ushort *)((long)local_70 + lVar18 * 2 + 6));
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
        uVar14 = (uint)uVar17;
        *paVar5->mFaces[uVar16].mIndices = uVar14 + 2;
        paVar5->mFaces[uVar16].mIndices[1] = uVar14 + 1;
        paVar5->mFaces[uVar16].mIndices[2] = uVar14;
        local_70 = local_70 + 3;
        uVar16 = uVar16 + 1;
        uVar17 = (ulong)(uVar14 + 3);
      } while (uVar16 < (uint)pcHeader->num_tris);
    }
  }
  if (this->iGSFileVersion == 5) {
    CalculateUVCoordinates_MDL5(this);
  }
  return;
}

Assistant:

void MDLImporter::InternReadFile_3DGS_MDL345( )
{
    ai_assert(NULL != pScene);

    // the header of MDL 3/4/5 is nearly identical to the original Quake1 header
    BE_NCONST MDL::Header *pcHeader = (BE_NCONST MDL::Header*)this->mBuffer;
#ifdef AI_BUILD_BIG_ENDIAN
    FlipQuakeHeader(pcHeader);
#endif
    ValidateHeader_Quake1(pcHeader);

    // current cursor position in the file
    const unsigned char* szCurrent = (const unsigned char*)(pcHeader+1);
    const unsigned char* szEnd = mBuffer + iFileSize;

    // need to read all textures
    for (unsigned int i = 0; i < (unsigned int)pcHeader->num_skins;++i) {
        if (szCurrent >= szEnd) {
            throw DeadlyImportError( "Texture data past end of file.");
        }
        BE_NCONST MDL::Skin* pcSkin;
        pcSkin = (BE_NCONST  MDL::Skin*)szCurrent;
        AI_SWAP4( pcSkin->group);
        // create one output image
        unsigned int iSkip = i ? UINT_MAX : 0;
        if (5 <= iGSFileVersion)
        {
            // MDL5 format could contain MIPmaps
            CreateTexture_3DGS_MDL5((unsigned char*)pcSkin + sizeof(uint32_t),
                pcSkin->group,&iSkip);
        }
        else    {
            CreateTexture_3DGS_MDL4((unsigned char*)pcSkin + sizeof(uint32_t),
                pcSkin->group,&iSkip);
        }
        // need to skip one image
        szCurrent += iSkip + sizeof(uint32_t);

    }
    // get a pointer to the texture coordinates
    BE_NCONST MDL::TexCoord_MDL3* pcTexCoords = (BE_NCONST MDL::TexCoord_MDL3*)szCurrent;
    szCurrent += sizeof(MDL::TexCoord_MDL3) * pcHeader->synctype;

    // NOTE: for MDLn formats "synctype" corresponds to the number of UV coords

    // get a pointer to the triangles
    BE_NCONST MDL::Triangle_MDL3* pcTriangles = (BE_NCONST MDL::Triangle_MDL3*)szCurrent;
    szCurrent += sizeof(MDL::Triangle_MDL3) * pcHeader->num_tris;

#ifdef AI_BUILD_BIG_ENDIAN

    for (int i = 0; i<pcHeader->synctype;++i)   {
        AI_SWAP2( pcTexCoords[i].u );
        AI_SWAP2( pcTexCoords[i].v );
    }

    for (int i = 0; i<pcHeader->num_tris;++i)   {
        AI_SWAP2( pcTriangles[i].index_xyz[0]);
        AI_SWAP2( pcTriangles[i].index_xyz[1]);
        AI_SWAP2( pcTriangles[i].index_xyz[2]);
        AI_SWAP2( pcTriangles[i].index_uv[0]);
        AI_SWAP2( pcTriangles[i].index_uv[1]);
        AI_SWAP2( pcTriangles[i].index_uv[2]);
    }

#endif

    VALIDATE_FILE_SIZE(szCurrent);

    // setup materials
    SetupMaterialProperties_3DGS_MDL5_Quake1();

    // allocate enough storage to hold all vertices and triangles
    aiMesh* pcMesh = new aiMesh();
    pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

    pcMesh->mNumVertices = pcHeader->num_tris * 3;
    pcMesh->mNumFaces = pcHeader->num_tris;
    pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];

    // there won't be more than one mesh inside the file
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mNumMeshes = 1;
    pScene->mRootNode->mMeshes = new unsigned int[1];
    pScene->mRootNode->mMeshes[0] = 0;
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];
    pScene->mMeshes[0] = pcMesh;

    // allocate output storage
    pcMesh->mNumVertices = (unsigned int)pcHeader->num_tris*3;
    pcMesh->mVertices    = new aiVector3D[pcMesh->mNumVertices];
    pcMesh->mNormals     = new aiVector3D[pcMesh->mNumVertices];

    if (pcHeader->synctype) {
        pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
        pcMesh->mNumUVComponents[0] = 2;
    }

    // now get a pointer to the first frame in the file
    BE_NCONST MDL::Frame* pcFrames = (BE_NCONST MDL::Frame*)szCurrent;
    AI_SWAP4(pcFrames->type);

    // byte packed vertices
    // FIXME: these two snippets below are almost identical ... join them?
    /////////////////////////////////////////////////////////////////////////////////////
    if (0 == pcFrames->type || 3 >= this->iGSFileVersion)   {

        const MDL::SimpleFrame* pcFirstFrame = (const MDL::SimpleFrame*)(szCurrent + sizeof(uint32_t));
        const MDL::Vertex* pcVertices = (const MDL::Vertex*) ((pcFirstFrame->name) + sizeof(pcFirstFrame->name));

        VALIDATE_FILE_SIZE(pcVertices + pcHeader->num_verts);

        // now iterate through all triangles
        unsigned int iCurrent = 0;
        for (unsigned int i = 0; i < (unsigned int) pcHeader->num_tris;++i) {
            pcMesh->mFaces[i].mIndices = new unsigned int[3];
            pcMesh->mFaces[i].mNumIndices = 3;

            unsigned int iTemp = iCurrent;
            for (unsigned int c = 0; c < 3;++c,++iCurrent)  {
                // read vertices
                unsigned int iIndex = pcTriangles->index_xyz[c];
                if (iIndex >= (unsigned int)pcHeader->num_verts)    {
                    iIndex = pcHeader->num_verts-1;
                    ASSIMP_LOG_WARN("Index overflow in MDLn vertex list");
                }

                aiVector3D& vec = pcMesh->mVertices[iCurrent];
                vec.x = (float)pcVertices[iIndex].v[0] * pcHeader->scale[0];
                vec.x += pcHeader->translate[0];

                vec.y = (float)pcVertices[iIndex].v[1] * pcHeader->scale[1];
                vec.y += pcHeader->translate[1];
                // vec.y *= -1.0f;

                vec.z = (float)pcVertices[iIndex].v[2] * pcHeader->scale[2];
                vec.z += pcHeader->translate[2];

                // read the normal vector from the precalculated normal table
                MD2::LookupNormalIndex(pcVertices[iIndex].normalIndex,pcMesh->mNormals[iCurrent]);
                // pcMesh->mNormals[iCurrent].y *= -1.0f;

                // read texture coordinates
                if (pcHeader->synctype) {
                    ImportUVCoordinate_3DGS_MDL345(pcMesh->mTextureCoords[0][iCurrent],
                        pcTexCoords,pcTriangles->index_uv[c]);
                }
            }
            pcMesh->mFaces[i].mIndices[0] = iTemp+2;
            pcMesh->mFaces[i].mIndices[1] = iTemp+1;
            pcMesh->mFaces[i].mIndices[2] = iTemp+0;
            pcTriangles++;
        }

    }
    // short packed vertices
    /////////////////////////////////////////////////////////////////////////////////////
    else    {
        // now get a pointer to the first frame in the file
        const MDL::SimpleFrame_MDLn_SP* pcFirstFrame = (const MDL::SimpleFrame_MDLn_SP*) (szCurrent + sizeof(uint32_t));

        // get a pointer to the vertices
        const MDL::Vertex_MDL4* pcVertices = (const MDL::Vertex_MDL4*) ((pcFirstFrame->name) +
            sizeof(pcFirstFrame->name));

        VALIDATE_FILE_SIZE(pcVertices + pcHeader->num_verts);

        // now iterate through all triangles
        unsigned int iCurrent = 0;
        for (unsigned int i = 0; i < (unsigned int) pcHeader->num_tris;++i) {
            pcMesh->mFaces[i].mIndices = new unsigned int[3];
            pcMesh->mFaces[i].mNumIndices = 3;

            unsigned int iTemp = iCurrent;
            for (unsigned int c = 0; c < 3;++c,++iCurrent)  {
                // read vertices
                unsigned int iIndex = pcTriangles->index_xyz[c];
                if (iIndex >= (unsigned int)pcHeader->num_verts)    {
                    iIndex = pcHeader->num_verts-1;
                    ASSIMP_LOG_WARN("Index overflow in MDLn vertex list");
                }

                aiVector3D& vec = pcMesh->mVertices[iCurrent];
                vec.x = (float)pcVertices[iIndex].v[0] * pcHeader->scale[0];
                vec.x += pcHeader->translate[0];

                vec.y = (float)pcVertices[iIndex].v[1] * pcHeader->scale[1];
                vec.y += pcHeader->translate[1];
                // vec.y *= -1.0f;

                vec.z = (float)pcVertices[iIndex].v[2] * pcHeader->scale[2];
                vec.z += pcHeader->translate[2];

                // read the normal vector from the precalculated normal table
                MD2::LookupNormalIndex(pcVertices[iIndex].normalIndex,pcMesh->mNormals[iCurrent]);
                // pcMesh->mNormals[iCurrent].y *= -1.0f;

                // read texture coordinates
                if (pcHeader->synctype) {
                    ImportUVCoordinate_3DGS_MDL345(pcMesh->mTextureCoords[0][iCurrent],
                        pcTexCoords,pcTriangles->index_uv[c]);
                }
            }
            pcMesh->mFaces[i].mIndices[0] = iTemp+2;
            pcMesh->mFaces[i].mIndices[1] = iTemp+1;
            pcMesh->mFaces[i].mIndices[2] = iTemp+0;
            pcTriangles++;
        }
    }

    // For MDL5 we will need to build valid texture coordinates
    // basing upon the file loaded (only support one file as skin)
    if (0x5 == iGSFileVersion)
        CalculateUVCoordinates_MDL5();
    return;
}